

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_235b14::NullBackend::open(NullBackend *this,char *__file,int __oflag,...)

{
  int iVar1;
  backend_exception *this_00;
  
  if ((__file != (char *)0x0) && (iVar1 = strcmp(__file,"No Output"), iVar1 != 0)) {
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file);
    __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  iVar1 = std::__cxx11::string::assign((char *)&((this->super_BackendBase).mDevice)->DeviceName);
  return iVar1;
}

Assistant:

void NullBackend::open(const ALCchar *name)
{
    if(!name)
        name = nullDevice;
    else if(strcmp(name, nullDevice) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mDevice->DeviceName = name;
}